

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb99.c
# Opt level: O0

err_t stb99ParamsVal(stb99_params *params)

{
  bool_t bVar1;
  int iVar2;
  void *n_00;
  ulong no_00;
  ulong m_00;
  ulong uVar3;
  size_t sVar4;
  size_t sVar5;
  size_t no_01;
  octet *mod;
  qr_o *r;
  size_t l;
  word *r_00;
  word *b;
  size_t *in_RDI;
  void *stack;
  qr_o *qr;
  word *a;
  word *d;
  word *t;
  word *q;
  word *p;
  void *state;
  size_t mo;
  size_t m;
  size_t no;
  size_t n;
  void *in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  size_t *dest;
  void *stack_00;
  word *pwVar6;
  size_t *stack_01;
  qr_o *r_01;
  word *q_00;
  word *a_00;
  word *a_01;
  ulong local_18;
  err_t local_4;
  
  bVar1 = memIsValid(in_RDI,0x3d0);
  if (bVar1 == 0) {
    local_4 = 0x6d;
  }
  else {
    for (local_18 = 0; (local_18 < 10 && (_ls[local_18] != *in_RDI)); local_18 = local_18 + 1) {
    }
    if ((local_18 == 10) || (_rs[local_18] != in_RDI[1])) {
      local_4 = 0x1f6;
    }
    else {
      n_00 = (void *)(*in_RDI + 0x3f >> 6);
      no_00 = *in_RDI + 7 >> 3;
      m_00 = in_RDI[1] + 0x3f >> 6;
      uVar3 = in_RDI[1] + 7 >> 3;
      sVar4 = ((long)n_00 * 3 + 1) * 8;
      sVar5 = zmMontCreate_keep(no_00);
      sVar5 = sVar4 + sVar5;
      no_01 = priIsPrime_deep(0x169a09);
      mod = (octet *)zzDiv_deep((size_t)n_00,m_00);
      r = (qr_o *)zmMontCreate_deep(no_01);
      l = (long)n_00 + (1 - m_00);
      stack_00 = n_00;
      zmMontCreate_deep(no_01);
      sVar4 = qrPower_deep((size_t)stack_00,sVar4,in_stack_ffffffffffffff50);
      utilMax(4,no_01,mod,r,sVar4);
      r_00 = (word *)blobCreate((size_t)in_stack_ffffffffffffff48);
      if (r_00 == (word *)0x0) {
        local_4 = 0x6e;
      }
      else {
        a_00 = r_00 + (long)n_00;
        q_00 = a_00 + m_00;
        r_01 = (qr_o *)(q_00 + (long)n_00 + (1 - m_00));
        dest = &(r_01->hdr).keep + (long)n_00;
        stack_01 = dest;
        a_01 = r_00;
        sVar4 = zmMontCreate_keep(no_00);
        b = (word *)((long)dest + sVar4);
        u64From(dest,in_stack_ffffffffffffff48,0x169b9d);
        bVar1 = memIsZero((void *)((long)in_RDI + no_00 + 0x10),0x134 - no_00);
        if (((bVar1 == 0) ||
            (sVar4 = wwBitSize(dest,(size_t)in_stack_ffffffffffffff48), sVar4 != *in_RDI)) ||
           (bVar1 = priIsPrime(dest,(size_t)in_stack_ffffffffffffff48,(void *)0x169bfe), bVar1 == 0)
           ) {
          blobClose((blob_t)0x169c10);
          local_4 = 0x1f6;
        }
        else {
          u64From(dest,in_stack_ffffffffffffff48,0x169c41);
          bVar1 = memIsZero((void *)((long)in_RDI + uVar3 + 0x144),0x21 - uVar3);
          if (((bVar1 == 0) ||
              (sVar4 = wwBitSize(dest,(size_t)in_stack_ffffffffffffff48), sVar4 != in_RDI[1])) ||
             (bVar1 = priIsPrime(dest,(size_t)in_stack_ffffffffffffff48,(void *)0x169ca6),
             bVar1 == 0)) {
            blobClose((blob_t)0x169cb8);
            local_4 = 0x1f6;
          }
          else {
            zzSubW2(a_01,(size_t)n_00,1);
            pwVar6 = b;
            zzDiv(q_00,r_00,(word *)r_01,(size_t)stack_01,b,sVar5,a_01);
            bVar1 = wwIsZero(a_01,m_00);
            if (bVar1 == 0) {
              blobClose((blob_t)0x169d35);
              local_4 = 0x1f6;
            }
            else {
              zmMontCreate(r,mod,no_01,l,stack_00);
              bVar1 = memIsZero((void *)((long)in_RDI + no_00 + 0x299),0x134 - no_00);
              if ((bVar1 == 0) ||
                 (iVar2 = (*(code *)stack_01[8])(r_00,(long)in_RDI + 0x299,stack_01,pwVar6),
                 iVar2 == 0)) {
                blobClose((blob_t)0x169de0);
                local_4 = 0x1f6;
              }
              else {
                qrPower(a_01,a_00,q_00,(size_t)r_00,r_01,stack_01);
                bVar1 = wwEq(r_00,(word *)stack_01[4],stack_01[6]);
                if (bVar1 == 0) {
                  u64From(dest,b,0x169e81);
                  bVar1 = memIsZero((void *)((long)in_RDI + no_00 + 0x165),0x134 - no_00);
                  if ((bVar1 == 0) || (bVar1 = wwEq((word *)r_01,r_00,(size_t)n_00), bVar1 == 0)) {
                    blobClose((blob_t)0x169ed8);
                    local_4 = 0x1f6;
                  }
                  else {
                    blobClose((blob_t)0x169ef2);
                    local_4 = 0;
                  }
                }
                else {
                  blobClose((blob_t)0x169e50);
                  local_4 = 0x1f6;
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

err_t stb99ParamsVal(const stb99_params* params)
{
	size_t n, no;
	size_t m, mo;
	// состояние 
	void* state;
	word* p;
	word* q;
	word* t;
	word* d;
	word* a;
	qr_o* qr;
	void* stack;
	// проверить указатели
	if (!memIsValid(params, sizeof(stb99_params)))
		return ERR_BAD_INPUT;
	// проверить размерности
	for (n = 0; n < COUNT_OF(_ls); ++n)
		if (_ls[n] == params->l)
			break;
	if (n == COUNT_OF(_ls) || _rs[n] != params->r)
		return ERR_BAD_PARAMS;
	// размерности
	n = W_OF_B(params->l), no = O_OF_B(params->l);
	m = W_OF_B(params->r), mo = O_OF_B(params->r);
	// создать состояние
	state = blobCreate(
		O_OF_W(3 * n + 1) + zmMontCreate_keep(no) +  
		utilMax(4,
			priIsPrime_deep(n),
			zzDiv_deep(n, m),
			zmMontCreate_deep(no),
			qrPower_deep(n, n - m + 1, zmMontCreate_deep(no))));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// раскладка состояния
	p = d = (word*)state;
	q = p + n;
	t = q + m;
	a = t + n - m + 1;
	qr = (qr_o*)(a + n);
	stack = (octet*)qr + zmMontCreate_keep(no);
	// p -- l-битовое простое?
	wwFrom(p, params->p, no);
	if (!memIsZero(params->p + no, sizeof(params->p) - no) ||
		wwBitSize(p, n) != params->l || !priIsPrime(p, n, stack))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// q -- r-битовое простое?
	wwFrom(q, params->q, mo);
	if (!memIsZero(params->q + mo, sizeof(params->q) - mo) ||
		wwBitSize(q, m) != params->r || !priIsPrime(q, m, stack))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// t <- (p - 1) div q
	zzSubW2(p, n, 1);
	zzDiv(t, p, p, n, q, m, stack);
	// q | p - 1?
	if (!wwIsZero(p, m))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// построить кольцо Монтгомери
	zmMontCreate(qr, params->p, no, params->l + 2, stack);
	// загрузить d
	if (!memIsZero(params->d + no, sizeof(params->d) - no) ||
		!qrFrom(d, params->d, qr, stack))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// d <- d^((p - 1)/q) \neq e?
	qrPower(d, d, t, n - m + 1, qr, stack);
	if (qrIsUnity(d, qr))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// a == params->a?
	wwFrom(a, params->a, no);
	if (!memIsZero(params->a + no, sizeof(params->a) - no) ||
		!wwEq(a, d, n))
	{
		blobClose(state);
		return ERR_BAD_PARAMS;
	}
	// все нормально
	blobClose(state);
	return ERR_OK;
}